

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

HFSubWorker * __thiscall
MlmWrap::createWorkerSub
          (MlmWrap *this,HighFreqDataType *dt,int numThreads,hfs_data_callback_fn userFoo,void *args
          )

{
  SubType SVar1;
  HFSubWorker *this_00;
  HFSubSockSettings sockInfo;
  HighFreqDataType local_2a0;
  HFSubSockSettings local_210;
  HighFreqDataType local_168;
  SubType local_d8;
  undefined4 uStack_d4;
  hfs_data_callback_fn p_Stack_d0;
  void *local_c8;
  HighFreqDataType local_c0;
  
  this_00 = (HFSubWorker *)operator_new(0xf0);
  HighFreqDataType::HighFreqDataType(&local_2a0,dt);
  HFSubWorker::HFSubWorker(this_00,&local_2a0,numThreads,userFoo,args);
  HighFreqDataType::~HighFreqDataType(&local_2a0);
  addSubToList(this,(HighFreqSub *)this_00);
  HighFreqDataType::HighFreqDataType(&local_c0,dt);
  SVar1 = (this_00->super_HighFreqSub).sockType;
  HighFreqDataType::HighFreqDataType(&local_168,&local_c0);
  local_d8 = SVar1;
  p_Stack_d0 = userFoo;
  local_c8 = args;
  HighFreqDataType::~HighFreqDataType(&local_c0);
  HighFreqDataType::HighFreqDataType(&local_210.dataType,&local_168);
  local_210.args = local_c8;
  local_210._148_4_ = uStack_d4;
  local_210.subSockType = local_d8;
  local_210.userFoo = p_Stack_d0;
  addHfTypeToSubbedList(this,&local_210);
  HighFreqDataType::~HighFreqDataType(&local_210.dataType);
  HighFreqDataType::~HighFreqDataType(&local_168);
  return this_00;
}

Assistant:

HFSubWorker* MlmWrap::createWorkerSub(HighFreqDataType dt, int numThreads, hfs_data_callback_fn userFoo, void *args) {
    HFSubWorker *newSub = new HFSubWorker(dt, numThreads, userFoo, args);
    addSubToList(newSub);
    HFSubSockSettings sockInfo(dt, newSub->getSubSockType(), userFoo, args);
    addHfTypeToSubbedList(sockInfo);
    //todo: add a check to see if newSub was created properly, if not, don't add the type to the subbedList

    return(newSub);
}